

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void __thiscall
edition_unittest::TestMixedFieldsAndExtensions::Clear(TestMixedFieldsAndExtensions *this)

{
  RepeatedField<unsigned_int> *this_00;
  ulong uVar1;
  int iVar2;
  bool is_soo;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  this_00 = &(this->field_0)._impl_.b_;
  uVar1 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar1 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  is_soo = (uVar1 & 4) == 0;
  google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  google::protobuf::RepeatedField<unsigned_int>::set_size(this_00,(uVar1 & 4) == 0,0);
  (this->field_0)._impl_.a_ = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMixedFieldsAndExtensions::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.b_.Clear();
  _impl_.a_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}